

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,long64 topY)

{
  IntPoint pt2b;
  IntPoint pt4;
  IntPoint pt4_00;
  bool bVar1;
  TEdge *pTVar2;
  size_type sVar3;
  reference ppHVar4;
  long64 lVar5;
  IntPoint local_160;
  IntPoint local_150;
  IntPoint local_140;
  IntPoint local_130;
  IntPoint local_120;
  IntPoint local_110;
  IntPoint local_100;
  IntPoint local_f0;
  IntPoint local_e0;
  IntPoint local_d0;
  IntPoint local_c0;
  IntPoint local_b0;
  IntPoint local_a0;
  IntPoint local_90;
  IntPoint local_80;
  value_type local_70;
  HorzJoinRec *hj;
  IntPoint pt2;
  IntPoint pt;
  size_type i;
  TEdge *local_30;
  TEdge *ePrior;
  TEdge *e;
  long64 topY_local;
  Clipper *this_local;
  
  ePrior = this->m_ActiveEdges;
  e = (TEdge *)topY;
  topY_local = (long64)this;
  while (ePrior != (TEdge *)0x0) {
    bVar1 = IsMaxima(ePrior,(long64)e);
    if ((!bVar1) ||
       ((pTVar2 = GetMaximaPair(ePrior), -1e-20 < pTVar2->dx - -1e+40 &&
        (pTVar2 = GetMaximaPair(ePrior), pTVar2->dx - -1e+40 < 1e-20)))) {
      bVar1 = IsIntermediate(ePrior,(long64)e);
      pTVar2 = ePrior;
      if (((!bVar1) || (ePrior->nextInLML->dx - -1e+40 <= -1e-20)) ||
         (1e-20 <= ePrior->nextInLML->dx - -1e+40)) {
        lVar5 = TopX(ePrior,(long64)e);
        ePrior->xcurr = lVar5;
        ePrior->ycurr = (long64)e;
      }
      else {
        if (-1 < ePrior->outIdx) {
          IntPoint::IntPoint((IntPoint *)&i,ePrior->xtop,ePrior->ytop);
          AddOutPt(this,pTVar2,(IntPoint *)&i);
          for (pt.Y = 0;
              sVar3 = std::
                      vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                      ::size(&this->m_HorizJoins), (ulong)pt.Y < sVar3; pt.Y = pt.Y + 1) {
            IntPoint::IntPoint((IntPoint *)&pt2.Y,0,0);
            IntPoint::IntPoint((IntPoint *)&hj,0,0);
            ppHVar4 = std::
                      vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                      ::operator[](&this->m_HorizJoins,pt.Y);
            local_70 = *ppHVar4;
            IntPoint::IntPoint(&local_80,local_70->edge->xbot,local_70->edge->ybot);
            IntPoint::IntPoint(&local_90,local_70->edge->xtop,local_70->edge->ytop);
            IntPoint::IntPoint(&local_a0,ePrior->nextInLML->xbot,ePrior->nextInLML->ybot);
            IntPoint::IntPoint(&local_b0,ePrior->nextInLML->xtop,ePrior->nextInLML->ytop);
            pt2b.Y = local_b0.Y;
            pt2b.X = local_b0.X;
            bVar1 = GetOverlapSegment(local_80,local_90,local_a0,pt2b,(IntPoint *)&pt2.Y,
                                      (IntPoint *)&hj);
            if (bVar1) {
              AddJoin(this,local_70->edge,ePrior->nextInLML,local_70->savedIdx,ePrior->outIdx);
            }
          }
          AddHorzJoin(this,ePrior->nextInLML,ePrior->outIdx);
        }
        UpdateEdgeIntoAEL(this,&ePrior);
        AddEdgeToSEL(this,ePrior);
      }
      ePrior = ePrior->nextInAEL;
    }
    else {
      local_30 = ePrior->prevInAEL;
      DoMaxima(this,ePrior,(long64)e);
      if (local_30 == (TEdge *)0x0) {
        ePrior = this->m_ActiveEdges;
      }
      else {
        ePrior = local_30->nextInAEL;
      }
    }
  }
  ProcessHorizontals(this);
  ePrior = this->m_ActiveEdges;
  do {
    if (ePrior == (TEdge *)0x0) {
      return;
    }
    bVar1 = IsIntermediate(ePrior,(long64)e);
    pTVar2 = ePrior;
    if (bVar1) {
      if (-1 < ePrior->outIdx) {
        IntPoint::IntPoint(&local_c0,ePrior->xtop,ePrior->ytop);
        AddOutPt(this,pTVar2,&local_c0);
      }
      UpdateEdgeIntoAEL(this,&ePrior);
      if (((-1 < ePrior->outIdx) && (ePrior->prevInAEL != (TEdge *)0x0)) &&
         ((-1 < ePrior->prevInAEL->outIdx &&
          ((ePrior->prevInAEL->xcurr == ePrior->xbot && (ePrior->prevInAEL->ycurr == ePrior->ybot)))
          ))) {
        IntPoint::IntPoint(&local_d0,ePrior->xbot,ePrior->ybot);
        IntPoint::IntPoint(&local_e0,ePrior->xtop,ePrior->ytop);
        IntPoint::IntPoint(&local_f0,ePrior->xbot,ePrior->ybot);
        IntPoint::IntPoint(&local_100,ePrior->prevInAEL->xtop,ePrior->prevInAEL->ytop);
        pt4.Y = local_100.Y;
        pt4.X = local_100.X;
        bVar1 = SlopesEqual(local_d0,local_e0,local_f0,pt4,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ] & 1));
        if (bVar1) {
          pTVar2 = ePrior->prevInAEL;
          IntPoint::IntPoint(&local_110,ePrior->xbot,ePrior->ybot);
          AddOutPt(this,pTVar2,&local_110);
          AddJoin(this,ePrior,ePrior->prevInAEL,-1,-1);
          goto LAB_00b21c66;
        }
      }
      if (((((-1 < ePrior->outIdx) && (ePrior->nextInAEL != (TEdge *)0x0)) &&
           (-1 < ePrior->nextInAEL->outIdx)) &&
          ((ePrior->nextInAEL->ytop < ePrior->nextInAEL->ycurr &&
           (ePrior->nextInAEL->ycurr <= ePrior->nextInAEL->ybot)))) &&
         ((ePrior->nextInAEL->xcurr == ePrior->xbot && (ePrior->nextInAEL->ycurr == ePrior->ybot))))
      {
        IntPoint::IntPoint(&local_120,ePrior->xbot,ePrior->ybot);
        IntPoint::IntPoint(&local_130,ePrior->xtop,ePrior->ytop);
        IntPoint::IntPoint(&local_140,ePrior->xbot,ePrior->ybot);
        IntPoint::IntPoint(&local_150,ePrior->nextInAEL->xtop,ePrior->nextInAEL->ytop);
        pt4_00.Y = local_150.Y;
        pt4_00.X = local_150.X;
        bVar1 = SlopesEqual(local_120,local_130,local_140,pt4_00,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ] & 1));
        if (bVar1) {
          pTVar2 = ePrior->nextInAEL;
          IntPoint::IntPoint(&local_160,ePrior->xbot,ePrior->ybot);
          AddOutPt(this,pTVar2,&local_160);
          AddJoin(this,ePrior,ePrior->nextInAEL,-1,-1);
        }
      }
    }
LAB_00b21c66:
    ePrior = ePrior->nextInAEL;
  } while( true );
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const long64 topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    if( IsMaxima(e, topY) && !NEAR_EQUAL(GetMaximaPair(e)->dx, HORIZONTAL) )
    {
      //'e' might be removed from AEL, as may any following edges so ...
      TEdge* ePrior = e->prevInAEL;
      DoMaxima(e, topY);
      if( !ePrior ) e = m_ActiveEdges;
      else e = ePrior->nextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update xcurr and ycurr ...
      if(  IsIntermediate(e, topY) && NEAR_EQUAL(e->nextInLML->dx, HORIZONTAL) )
      {
        if (e->outIdx >= 0)
        {
          AddOutPt(e, IntPoint(e->xtop, e->ytop));

          for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
          {
            IntPoint pt, pt2;
            HorzJoinRec* hj = m_HorizJoins[i];
            if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
              IntPoint(hj->edge->xtop, hj->edge->ytop),
              IntPoint(e->nextInLML->xbot, e->nextInLML->ybot),
              IntPoint(e->nextInLML->xtop, e->nextInLML->ytop), pt, pt2))
                AddJoin(hj->edge, e->nextInLML, hj->savedIdx, e->outIdx);
          }

          AddHorzJoin(e->nextInLML, e->outIdx);
        }
        UpdateEdgeIntoAEL(e);
        AddEdgeToSEL(e);
      } else
      {
        //this just simplifies horizontal processing ...
        e->xcurr = TopX( *e, topY );
        e->ycurr = topY;
      }
      e = e->nextInAEL;
    }
  }

  //3. Process horizontals at the top of the scanbeam ...
  ProcessHorizontals();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while( e )
  {
    if( IsIntermediate( e, topY ) )
    {
      if( e->outIdx >= 0 ) AddOutPt(e, IntPoint(e->xtop,e->ytop));
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      if (e->outIdx >= 0 && e->prevInAEL && e->prevInAEL->outIdx >= 0 &&
        e->prevInAEL->xcurr == e->xbot && e->prevInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->prevInAEL->xtop, e->prevInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->prevInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->prevInAEL);
      }
      else if (e->outIdx >= 0 && e->nextInAEL && e->nextInAEL->outIdx >= 0 &&
        e->nextInAEL->ycurr > e->nextInAEL->ytop &&
        e->nextInAEL->ycurr <= e->nextInAEL->ybot &&
        e->nextInAEL->xcurr == e->xbot && e->nextInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->nextInAEL->xtop, e->nextInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->nextInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->nextInAEL);
      }
    }
    e = e->nextInAEL;
  }
}